

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_cooling_mist(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,(int)gsn_cooling_mist);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    if (in_RDX != in_RCX) {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
    init_affect((AFFECT_DATA *)0x6e946f);
    std::pow<int,int>(0,0x6e94d7);
    affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void spell_cooling_mist(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_cooling_mist))
	{
		send_to_char("They are already surrounded by a cooling mist.\n\r", ch);
		return;
	}

	if (ch != victim)
		act("You conjure a soothing mist to refresh $N and shelter $M from heat.", ch, 0, victim, TO_CHAR);

	act("A soothing mist envelops you, sheltering you from heat.", victim, 0, 0, TO_CHAR);
	act("A light mist envelops $n as $e appears soothed.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_RESIST;
	af.aftype = AFT_SPELL;
	af.type = gsn_cooling_mist;
	af.owner = ch;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 3;

	SET_BIT(af.bitvector, RES_FIRE);

	af.end_fun = 0;
	af.tick_fun = 0;
	af.mod_name = MOD_RESISTANCE;
	affect_to_char(victim, &af);
}